

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::Constraint::getUpperBound(Constraint *this,VectorDynSize *upperBound)

{
  long lVar1;
  long lVar2;
  VectorDynSize *in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x91) & 1) == 0) {
    local_1 = false;
  }
  else {
    lVar1 = iDynTree::VectorDynSize::size();
    lVar2 = iDynTree::VectorDynSize::size();
    if (lVar1 != lVar2) {
      iDynTree::VectorDynSize::size();
      iDynTree::VectorDynSize::resize((ulong)in_RSI);
    }
    iDynTree::VectorDynSize::operator=(in_RSI,(VectorDynSize *)(in_RDI + 0x70));
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Constraint::getUpperBound(VectorDynSize &upperBound)
        {
            if (!m_isUpperBounded) {
                    return false;
            }
            if (upperBound.size() != m_upperBound.size()) {
                upperBound.resize(m_upperBound.size());
            }
            upperBound = m_upperBound;
            return true;
        }